

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_spec.c
# Opt level: O1

void test_delimiters_11(void)

{
  run("\"\\r\\n\" should be considered a newline for standalone tags","|\r\n{{= @ @ =}}\r\n|","{}",
      (char *)0x0,"|\r\n|");
  return;
}

Assistant:

static void
test_delimiters_11(void)
{
    run(
        "\"\\r\\n\" should be considered a newline for standalone tags",
        "|\r\n{{= @ @ =}}\r\n|",
        "{}",
        NULL,
        "|\r\n|"
    );
}